

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int voctok(voccxdef *ctx,char *cmd,char *outbuf,char **wrd,int lower,int cvt_ones,int show_errors)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ushort **ppuVar11;
  __int32_t **pp_Var12;
  vocwdef *pvVar13;
  size_t sVar14;
  byte *pbVar15;
  ushort *puVar16;
  byte *pbVar17;
  long lVar18;
  char *pcVar19;
  byte *pbVar20;
  char quote;
  byte bVar21;
  ulong uVar22;
  byte *pbVar23;
  char *pcVar24;
  char **local_90;
  uint local_84;
  int local_80;
  byte *local_50;
  
  pbVar17 = (byte *)cmd;
  uVar8 = 0;
LAB_001f5a22:
  while( true ) {
    pbVar17 = pbVar17 + 1;
    bVar21 = *cmd;
    if ((long)(char)bVar21 < 0) break;
    ppuVar11 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar11 + (long)(char)bVar21 * 2 + 1) & 0x20) == 0) {
      if (bVar21 == 0) {
        wrd[(int)uVar8] = outbuf;
        *outbuf = 0;
        return uVar8;
      }
      break;
    }
    cmd = (char *)((byte *)cmd + 1);
  }
  local_84 = uVar8 + 1;
  wrd[(int)uVar8] = outbuf;
  bVar21 = *cmd;
  uVar22 = (ulong)(char)bVar21;
  if ((((long)uVar22 < 0) || (ppuVar11 = __ctype_b_loc(), bVar21 == 0x2d)) ||
     (((*ppuVar11)[uVar22] & 0x400) != 0)) {
    lVar18 = 0;
    do {
      bVar21 = (byte)uVar22;
      if (-1 < (char)bVar21) {
        ppuVar11 = __ctype_b_loc();
        uVar22 = uVar22 & 0xff;
        if (((((*ppuVar11)[uVar22] & 0xc00) == 0) && (bVar21 != 0x2d)) && ((int)uVar22 != 0x27))
        goto LAB_001f5b7e;
        if ((lower != 0) && (((*ppuVar11)[uVar22] & 0x100) != 0)) {
          pp_Var12 = __ctype_tolower_loc();
          bVar21 = *(byte *)(*pp_Var12 + uVar22);
        }
      }
      ((byte *)outbuf)[lVar18] = bVar21;
      uVar22 = (ulong)((byte *)cmd)[lVar18 + 1];
      lVar18 = lVar18 + 1;
    } while( true );
  }
  pbVar20 = (byte *)outbuf;
  if (((*ppuVar11)[uVar22] >> 0xb & 1) == 0) {
    if (bVar21 < 0x40) {
      uVar22 = (ulong)(uint)bVar21;
      if ((0x8800400200000000U >> (uVar22 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> (uVar22 & 0x3f) & 1) != 0) {
          *outbuf = 0x22;
          pbVar20 = (byte *)outbuf + 3;
          for (; (bVar3 = *pbVar17, bVar3 != 0 && (bVar3 != bVar21)); pbVar17 = pbVar17 + 1) {
            if (bVar3 == 0x5c) {
              *pbVar20 = 0x5c;
              pbVar20 = pbVar20 + 1;
            }
            *pbVar20 = bVar3;
            pbVar20 = pbVar20 + 1;
          }
          *(short *)((byte *)outbuf + 1) = (short)pbVar20 - ((short)outbuf + 1);
          cmd = (char *)(pbVar17 + 1);
          if (*pbVar17 != bVar21) {
            cmd = (char *)pbVar17;
          }
          goto LAB_001f5e69;
        }
        if ((0x400100000000000U >> (uVar22 & 0x3f) & 1) == 0) goto LAB_001f5ee7;
        *outbuf = 0x2c;
      }
      else {
        *outbuf = 0x2e;
      }
      pbVar20 = (byte *)outbuf + 1;
      cmd = (char *)((byte *)cmd + 1);
      goto LAB_001f5e69;
    }
LAB_001f5ee7:
    if (show_errors != 0) {
      iVar10 = tio_is_html_mode();
      if (iVar10 == 0) {
        vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
      }
      else {
        outformat("\\H-");
        vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
        outformat("\\H+");
      }
    }
    return -1;
  }
  while ((((bVar21 = (byte)uVar22, (char)bVar21 < '\0' ||
           (((*ppuVar11)[uVar22 & 0xff] & 0xc00) != 0)) || (bVar21 == 0x2d)) ||
         ((int)(uVar22 & 0xff) == 0x27))) {
    *pbVar20 = bVar21;
    pbVar20 = pbVar20 + 1;
    pbVar17 = (byte *)cmd + 1;
    cmd = (char *)((byte *)cmd + 1);
    uVar22 = (ulong)*pbVar17;
  }
LAB_001f5e69:
  *pbVar20 = 0;
  outbuf = (char *)(pbVar20 + 1);
  pbVar17 = (byte *)cmd;
  uVar8 = local_84;
  goto LAB_001f5a22;
LAB_001f5b7e:
  pcVar19 = wrd[(int)uVar8];
  pbVar17 = (byte *)outbuf + lVar18;
  pbVar20 = pbVar17 + (uint)-(int)pcVar19;
  local_50 = (byte *)cmd + lVar18;
  if (bVar21 == 0x2e) {
    pbVar23 = (byte *)outbuf + lVar18 + 1;
    pbVar23[-1] = 0x2e;
    pbVar23[0] = 0;
    pbVar15 = (byte *)outbuf + (ulong)(uint)-(int)pcVar19 + lVar18 + 1;
    pvVar13 = vocffw(ctx,pcVar19,(int)pbVar15,(char *)0x0,0,3,(vocseadef *)0x0);
    if (pvVar13 == (vocwdef *)0x0) {
      pvVar13 = vocffw(ctx,pcVar19,(int)pbVar15,(char *)0x0,0,4,(vocseadef *)0x0);
      if (pvVar13 != (vocwdef *)0x0) {
        pbVar20 = (byte *)((ulong)pbVar15 & 0xffffffff);
        pbVar17 = pbVar23;
        local_50 = (byte *)cmd + lVar18 + 1;
      }
    }
    else {
      pbVar20 = (byte *)((ulong)pbVar15 & 0xffffffff);
      pbVar17 = pbVar23;
      local_50 = (byte *)cmd + lVar18 + 1;
    }
  }
  *pbVar17 = 0;
  puVar16 = (ushort *)ctx->voccxcpp;
  for (iVar10 = ctx->voccxcpl; iVar10 != 0;
      iVar10 = iVar10 - ((uint)uVar4 + (uint)uVar5 + (uint)uVar6)) {
    uVar4 = *puVar16;
    uVar22 = (ulong)uVar4;
    uVar5 = *(ushort *)((long)puVar16 + uVar22);
    lVar18 = uVar5 + uVar22;
    uVar6 = *(ushort *)((long)puVar16 + uVar5 + uVar22);
    if (((0 < (int)uVar8) && (local_80 = (int)pbVar20, local_80 == uVar5 - 2)) &&
       (iVar9 = bcmp(pcVar19,(void *)((long)puVar16 + uVar22 + 2),(ulong)pbVar20 & 0xffffffff),
       iVar9 == 0)) {
      pcVar7 = wrd[(ulong)local_84 - 2];
      sVar14 = strlen(pcVar7);
      if ((sVar14 == uVar4 - 2) && (iVar9 = bcmp(pcVar7,puVar16 + 1,sVar14), iVar9 == 0)) {
        memcpy(pcVar7,(void *)((long)puVar16 + lVar18 + 2),(ulong)(uVar6 - 2));
        wrd[(ulong)local_84 - 2][(ulong)uVar6 - 2] = '\0';
        local_84 = uVar8;
        break;
      }
    }
    puVar16 = (ushort *)((long)puVar16 + (ulong)uVar6 + lVar18);
  }
  pcVar19 = ctx->voccxspp;
  lVar18 = (long)(int)local_84;
  if (pcVar19 != (char *)0x0) {
    local_90 = wrd + lVar18 + -1;
    pcVar7 = wrd[lVar18 + -1];
    sVar14 = strlen(pcVar7);
    pcVar24 = pcVar19 + ctx->voccxspl;
LAB_001f5d96:
    if (pcVar19 < pcVar24) {
      cVar1 = pcVar19[1];
      if ((int)cVar1 != (int)sVar14) goto LAB_001f5ddd;
      cVar2 = *pcVar19;
      iVar10 = bcmp(pcVar19 + 2,pcVar7,(long)cVar1);
      if (iVar10 != 0) goto LAB_001f5ddd;
      if (cvt_ones == 0) {
        if ((byte)(cVar2 + 0xafU) < 0xfd) goto LAB_001f5e3c;
        goto LAB_001f5ddd;
      }
      if (cVar2 == 'O') goto LAB_001f5ddd;
LAB_001f5e3c:
      *pcVar7 = cVar2;
LAB_001f5e3f:
      (*local_90)[1] = '\0';
    }
    goto LAB_001f5e4b;
  }
  local_90 = wrd + lVar18 + -1;
  for (pcVar19 = &vocsptab[0].vocspout; ((vocspdef *)(pcVar19 + -8))->vocspin != (char *)0x0;
      pcVar19 = pcVar19 + 0x10) {
    pcVar7 = *local_90;
    iVar10 = strncmp(pcVar7,((vocspdef *)(pcVar19 + -8))->vocspin,6);
    if (iVar10 == 0) {
      cVar1 = *pcVar19;
      if (cvt_ones == 0) {
        if ((byte)(cVar1 + 0xb2U) < 3) goto LAB_001f5e32;
      }
      else if (cVar1 == 'O') goto LAB_001f5e32;
      *pcVar7 = cVar1;
      goto LAB_001f5e3f;
    }
LAB_001f5e32:
  }
LAB_001f5e4b:
  pcVar19 = wrd[lVar18 + -1];
  sVar14 = strlen(pcVar19);
  pbVar20 = (byte *)(pcVar19 + sVar14);
  cmd = (char *)local_50;
  goto LAB_001f5e69;
LAB_001f5ddd:
  pcVar19 = pcVar19 + 2 + cVar1;
  goto LAB_001f5d96;
}

Assistant:

int voctok(voccxdef *ctx, char *cmd, char *outbuf, char **wrd,
           int lower, int cvt_ones, int show_errors)
{
    int       i;
    vocspdef *x;
    int       l;
    char     *p;
    char     *w;
    uint      len;

    for (i = 0 ;; )
    {
        while (vocisspace(*cmd)) cmd++;
        if (!*cmd)
        {
            wrd[i] = outbuf;
            *outbuf = '\0';
            return(i);
        }

        wrd[i++] = outbuf;
        if (vocisalpha(*cmd) || *cmd == '-')
        {
            while(vocisalpha(*cmd) || vocisdigit(*cmd) ||
                  *cmd=='\'' || *cmd=='-')
            {
                *outbuf++ = (vocisupper(*cmd) && lower) ? tolower(*cmd) : *cmd;
                ++cmd;
            }
            
            /*
             *   Check for a special case:  abbreviations that end in a
             *   period.  For example, "Mr. Patrick J. Wayne."  We wish
             *   to absorb the period after "Mr" and the one after "J"
             *   into the respective words; we detect this condition by
             *   actually trying to find a word in the dictionary that
             *   has the period.
             */
            w = wrd[i-1];
            len = outbuf - w;
            if (*cmd == '.')
            {
                *outbuf++ = *cmd++;           /* add the period to the word */
                *outbuf = '\0';                        /* null-terminate it */
                ++len;
                if (!vocffw(ctx, (char *)w, len, 0, 0, PRP_NOUN,
                            (vocseadef *)0)
                    && !vocffw(ctx, (char *)w, len, 0, 0, PRP_ADJ,
                               (vocseadef *)0))
                {
                    /* no word with period in dictionary - remove period */
                    --outbuf;
                    --cmd;
                    --len;
                }
            }

            /* null-terminate the buffer */
            *outbuf = '\0';

            /* find compound words and glue them together */
            for (p = ctx->voccxcpp, l = ctx->voccxcpl ; l ; )
            {
                uint   l1 = osrp2(p);
                char  *p2 = p + l1;                      /* get second word */
                uint   l2 = osrp2(p2);
                char  *p3 = p2 + l2;                   /* get compound word */
                uint   l3 = osrp2(p3);
                
                if (i > 1 && len == (l2 - 2)
                    && !memcmp(w, p2 + 2, (size_t)len)
                    && strlen((char *)wrd[i-2]) == (l1 - 2)
                    && !memcmp(wrd[i-2], p + 2, (size_t)(l1 - 2)))
                {
                    memcpy(wrd[i-2], p3 + 2, (size_t)(l3 - 2));
                    *(wrd[i-2] + l3 - 2) = '\0';
                    --i;
                    break;
                }

                /* move on to the next word */
                l -= l1 + l2 + l3;
                p = p3 + l3;
            }

            /*
             *   Find any special keywords, and set to appropriate flag
             *   char.  Note that we no longer convert "of" in this
             *   fashion; "of" is now handled separately in order to
             *   facilitate its use as an ordinary preposition. 
             */
            if (ctx->voccxspp)
            {
                char  *p;
                char  *endp;
                char   typ;
                int    len;
                int    wrdlen = strlen((char *)wrd[i-1]);
                
                for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
                     p < endp ; )
                {
                    typ = *p++;
                    len = *p++;
                    if (len == wrdlen && !memcmp(p, wrd[i-1], (size_t)len)
                        && (cvt_ones || (typ != VOCW_ONE && typ != VOCW_ONES))
                        && typ != VOCW_OF)
                    {
                        *wrd[i-1] = typ;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                    p += len;
                }
            }
            else
            {
                for (x = vocsptab ; x->vocspin ; ++x)
                {
                    if (!strncmp((char *)wrd[i-1], (char *)x->vocspin,
                                 (size_t)6)
                        && (cvt_ones ||
                            (x->vocspout != VOCW_ONE
                             && x->vocspout != VOCW_ONES))
                        && x->vocspout != VOCW_OF)
                    {
                        *wrd[i-1] = x->vocspout;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                }
            }

            /* make sure the output pointer is fixed up to the right spot */
            outbuf = wrd[i-1];
            outbuf += strlen((char *)outbuf);
        }
        else if (vocisdigit( *cmd ))
        {
            while(vocisdigit(*cmd) || vocisalpha(*cmd)
                  || *cmd == '\'' || *cmd == '-')
                *outbuf++ = *cmd++;
        }
        else switch( *cmd )
        {
        case '.':
        case '!':
        case '?':
        case ';':
            *outbuf++ = VOCW_THEN;
            ++cmd;
            break;

        case ',':
        case ':':
            *outbuf++ = VOCW_AND;
            ++cmd;
            break;

        case '"':
        case '\'':
            {
                char  *lenptr;
                char   quote = *cmd++;

                /* 
                 *   remember that this is a quoted string (it doesn't
                 *   matter whether they're actually using single or
                 *   double quotes - in either case, we use '"' as the
                 *   flag to indicate that it's a quote string)
                 */
                *outbuf++ = '"';

                /* make room for the length prefix */
                lenptr = outbuf;
                outbuf += 2;

                /* copy up to the matching close quote */
                while (*cmd && *cmd != quote)
                {
                    char c;

                    /* get this character */
                    c = *cmd++;
                    
                    /* escape the character if necessary */
                    switch(c)
                    {
                    case '\\':
                        *outbuf++ = '\\';
                        break;
                    }

                    /* copy this character */
                    *outbuf++ = c;
                }
                
                oswp2(lenptr, ((int)(outbuf - lenptr)));
                if (*cmd == quote) cmd++;
                break;
            }

        default:
            /* display an error if appropriate */
            if (show_errors)
            {
                int hmode = tio_is_html_mode();

                /* 
                 *   if we're in HTML mode, switch out momentarily, so that
                 *   we show the character literally, even if it's a
                 *   markup-significant character (such as '<' or '&') 
                 */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H-");
                
                /* show the message */
                vocerr(ctx, VOCERR(1),
                       "I don't understand the punctuation \"%c\".", *cmd);

                /* restore HTML mode if appropriate */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H+");
            }

            /* return failure */
            return -1;
        }

        /* null-terminate the result */
        *outbuf++ = '\0';
    }
}